

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DrawMeshIndirect
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,DrawMeshIndirectAttribs *Attribs,
          int param_2)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  bool bVar3;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  COMMAND_QUEUE_TYPE extraout_DL_00;
  char *in_R8;
  char (*in_R9) [8];
  PipelineStateVkImpl *pPVar4;
  string msg;
  string local_60;
  String local_40;
  
  Type = (COMMAND_QUEUE_TYPE)param_2;
  if ((Attribs->Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != DRAW_FLAG_NONE) {
    CVar2 = (this->m_Desc).QueueType;
    if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
      if ((this->m_Desc).IsDeferred == false) {
        FormatString<char[79]>
                  (&local_60,
                   (char (*) [79])
                   "Queue type may never be unknown for immediate contexts. This looks like a bug.")
        ;
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"DrawMeshIndirect",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x95c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      FormatString<char[97]>
                (&local_60,
                 (char (*) [97])
                 "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x95c);
      Type = extraout_DL;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        Type = extraout_DL_00;
      }
      CVar2 = (this->m_Desc).QueueType;
    }
    if ((~CVar2 & 7) != 0) {
      GetCommandQueueTypeString_abi_cxx11_(&local_40,(Diligent *)(ulong)CVar2,Type);
      in_R8 = " queue.";
      FormatString<char[17],char[22],std::__cxx11::string,char[8]>
                (&local_60,(Diligent *)"DrawMeshIndirect",(char (*) [17])0x90701a,
                 (char (*) [22])&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x95c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if ((((this->m_pDevice).m_pObject)->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.MeshShaders ==
        DEVICE_FEATURE_STATE_DISABLED) {
      FormatString<char[64]>
                (&local_60,
                 (char (*) [64])"DrawMeshIndirect: mesh shaders are not supported by this device");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x95e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if ((Attribs->pCounterBuffer != (IBuffer *)0x0) &&
       (((((this->m_pDevice).m_pObject)->
         super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
         ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.DrawCommand.CapFlags &
        DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER) == DRAW_COMMAND_CAP_FLAG_NONE)) {
      FormatString<char[134]>
                (&local_60,
                 (char (*) [134])
                 "DrawMeshIndirect command arguments are invalid: counter buffer requires DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER capability"
                );
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x961);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    pPVar4 = (this->m_pPipelineState).m_pObject;
    if (pPVar4 == (PipelineStateVkImpl *)0x0) {
      FormatString<char[76]>
                (&local_60,
                 (char (*) [76])
                 "DrawMeshIndirect command arguments are invalid: no pipeline state is bound.");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x964);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      pPVar4 = (this->m_pPipelineState).m_pObject;
    }
    PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
              (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    if ((pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
        .m_Desc.PipelineType != PIPELINE_TYPE_MESH) {
      pPVar4 = (this->m_pPipelineState).m_pObject;
      PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
                (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
      FormatString<char[65],char_const*,char[26]>
                (&local_60,
                 (Diligent *)"DrawMeshIndirect command arguments are invalid: pipeline state \'",
                 (char (*) [65])
                 &(pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                  .m_Desc,(char **)"\' is not a mesh pipeline.",(char (*) [26])in_R8);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x968);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    bVar3 = VerifyDrawMeshIndirectAttribs(Attribs,0xc);
    if (!bVar3) {
      FormatString<char[36]>(&local_60,(char (*) [36])"DrawMeshIndirectAttribs are invalid");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x96a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pUVar1 = &(this->m_Stats).CommandCounters.DrawMeshIndirect;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::DrawMeshIndirect(const DrawMeshIndirectAttribs& Attribs, int)
{
#ifdef DILIGENT_DEVELOPMENT
    if ((Attribs.Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != 0)
    {
        DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "DrawMeshIndirect");

        DEV_CHECK_ERR(m_pDevice->GetFeatures().MeshShaders, "DrawMeshIndirect: mesh shaders are not supported by this device");

        DEV_CHECK_ERR(Attribs.pCounterBuffer == nullptr || (m_pDevice->GetAdapterInfo().DrawCommand.CapFlags & DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER) != 0,
                      "DrawMeshIndirect command arguments are invalid: counter buffer requires DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER capability");
        // There is no need to check DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT because an indirect buffer can only be created if this capability is supported.

        DEV_CHECK_ERR(m_pPipelineState, "DrawMeshIndirect command arguments are invalid: no pipeline state is bound.");

        DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_MESH,
                      "DrawMeshIndirect command arguments are invalid: pipeline state '",
                      m_pPipelineState->GetDesc().Name, "' is not a mesh pipeline.");

        DEV_CHECK_ERR(VerifyDrawMeshIndirectAttribs(Attribs, DrawMeshIndirectCommandStride), "DrawMeshIndirectAttribs are invalid");
    }
#endif
    ++m_Stats.CommandCounters.DrawMeshIndirect;
}